

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

void __thiscall
ON_SubDHeap::ReturnOversizedElement(ON_SubDHeap *this,size_t capacity,ON__UINT_PTR *a)

{
  tagWSItem *memblock;
  tagWSItem *ptVar1;
  
  if (capacity == 0 || a == (ON__UINT_PTR *)0x0) {
    return;
  }
  memblock = (tagWSItem *)(a + -3);
  ptVar1 = (tagWSItem *)a[-2];
  if (memblock != this->m_ws) {
    if (ptVar1 != (tagWSItem *)0x0) {
      ptVar1->m_prev = memblock->m_prev;
    }
    memblock->m_prev->m_next = ptVar1;
    onfree(memblock);
    return;
  }
  if (ptVar1 != (tagWSItem *)0x0) {
    this->m_ws = ptVar1;
    ptVar1->m_prev = (tagWSItem *)0x0;
    onfree(memblock);
    return;
  }
  this->m_ws = (tagWSItem *)0x0;
  onfree(memblock);
  return;
}

Assistant:

void ON_SubDHeap::ReturnOversizedElement(
  size_t capacity,
  ON__UINT_PTR* a
  )
{
  if (0 != a && capacity > 0)
  {
    class tagWSItem* p = ((class tagWSItem*)(a - 1)) - 1;
    if (p == m_ws)
    {
      if (nullptr != p->m_next)
      {
        m_ws = p->m_next;
        p->m_next->m_prev = 0;
      }
      else
        m_ws = nullptr;
    }
    else
    {
      if (p->m_next)
        p->m_next->m_prev = p->m_prev;
      p->m_prev->m_next = p->m_next;
    }
    onfree(p);
  }
}